

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O1

int Cudd_zddVarsFromBddVars(DdManager *dd,int multiplicity)

{
  DdNode **ppDVar1;
  ulong uVar2;
  int iVar3;
  int *piVar4;
  MtrNode *pMVar5;
  char *vmask;
  char *lmask;
  ulong uVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  size_t __size;
  
  if (multiplicity < 1) {
    return 0;
  }
  uVar2 = (ulong)(uint)multiplicity;
  iVar3 = dd->sizeZ;
  iVar7 = dd->size * multiplicity;
  if ((iVar3 < iVar7) && (iVar7 = cuddResizeTableZdd(dd,iVar7 + -1), iVar7 == 0)) {
    return 0;
  }
  if (iVar3 == 0) {
    if (0 < dd->size) {
      uVar6 = 1;
      if (1 < multiplicity) {
        uVar6 = (ulong)(uint)multiplicity;
      }
      piVar4 = dd->perm;
      piVar8 = dd->permZ;
      piVar10 = dd->invpermZ;
      lVar9 = 0;
      lVar12 = 0;
      do {
        uVar11 = 0;
        do {
          lVar13 = (long)piVar4[lVar12] * (long)multiplicity + uVar11;
          piVar8[uVar11] = (int)lVar13;
          piVar10[lVar13] = (int)lVar9 + (int)uVar11;
          uVar11 = uVar11 + 1;
        } while (uVar6 != uVar11);
        lVar12 = lVar12 + 1;
        piVar8 = piVar8 + uVar2;
        lVar9 = lVar9 + uVar2;
      } while (lVar12 < dd->size);
    }
    iVar3 = dd->sizeZ;
    if (0 < (long)iVar3) {
      piVar4 = dd->invpermZ;
      ppDVar1 = dd->univ;
      lVar9 = 0;
      do {
        ppDVar1[lVar9]->index = piVar4[lVar9];
        lVar9 = lVar9 + 1;
      } while (iVar3 != lVar9);
    }
  }
  else {
    iVar3 = dd->sizeZ;
    piVar4 = (int *)malloc((long)iVar3 * 4);
    if (piVar4 == (int *)0x0) goto LAB_007f7f08;
    iVar7 = dd->size;
    if (0 < (long)iVar7) {
      uVar6 = 1;
      if (1 < multiplicity) {
        uVar6 = (ulong)(uint)multiplicity;
      }
      piVar8 = dd->invperm;
      lVar9 = 0;
      piVar10 = piVar4;
      do {
        uVar11 = 0;
        do {
          piVar10[uVar11] = piVar8[lVar9] * multiplicity + (int)uVar11;
          uVar11 = uVar11 + 1;
        } while (uVar6 != uVar11);
        lVar9 = lVar9 + 1;
        piVar10 = piVar10 + uVar2;
      } while (lVar9 != iVar7);
    }
    iVar7 = iVar7 * multiplicity;
    if (iVar7 < iVar3) {
      lVar9 = 0;
      do {
        piVar4[iVar7 + lVar9] = iVar7 + (int)lVar9;
        lVar9 = lVar9 + 1;
      } while ((long)iVar3 - (long)iVar7 != lVar9);
    }
    iVar3 = Cudd_zddShuffleHeap(dd,piVar4);
    free(piVar4);
    if (iVar3 == 0) {
      return 0;
    }
  }
  if (dd->treeZ != (MtrNode *)0x0) {
    Mtr_FreeTree(dd->treeZ);
    dd->treeZ = (MtrNode *)0x0;
  }
  if (dd->tree == (MtrNode *)0x0) {
    if (multiplicity == 1) {
      return 1;
    }
    pMVar5 = Mtr_InitGroupTree(0,dd->sizeZ);
    dd->treeZ = pMVar5;
    if (pMVar5 == (MtrNode *)0x0) {
      return 0;
    }
    pMVar5->index = *dd->invpermZ;
  }
  else {
    pMVar5 = Mtr_CopyTree(dd->tree,multiplicity);
    dd->treeZ = pMVar5;
    if (pMVar5 == (MtrNode *)0x0) {
      return 0;
    }
  }
  if (multiplicity == 1) {
    return 1;
  }
  iVar3 = dd->size;
  __size = (size_t)iVar3;
  vmask = (char *)malloc(__size);
  if ((vmask != (char *)0x0) && (lmask = (char *)malloc(__size), lmask != (char *)0x0)) {
    if (0 < iVar3) {
      memset(lmask,0,__size);
      memset(vmask,0,__size);
    }
    iVar3 = addMultiplicityGroups(dd,dd->treeZ,multiplicity,vmask,lmask);
    free(vmask);
    free(lmask);
    return (uint)(iVar3 != 0);
  }
LAB_007f7f08:
  dd->errorCode = CUDD_MEMORY_OUT;
  return 0;
}

Assistant:

int
Cudd_zddVarsFromBddVars(
  DdManager * dd /* DD manager */,
  int multiplicity /* how many ZDD variables are created for each BDD variable */)
{
    int res;
    int i, j;
    int allnew;
    int *permutation;

    if (multiplicity < 1) return(0);
    allnew = dd->sizeZ == 0;
    if (dd->size * multiplicity > dd->sizeZ) {
        res = cuddResizeTableZdd(dd,dd->size * multiplicity - 1);
        if (res == 0) return(0);
    }
    /* Impose the order of the BDD variables to the ZDD variables. */
    if (allnew) {
        for (i = 0; i < dd->size; i++) {
            for (j = 0; j < multiplicity; j++) {
                dd->permZ[i * multiplicity + j] =
                    dd->perm[i] * multiplicity + j;
                dd->invpermZ[dd->permZ[i * multiplicity + j]] =
                    i * multiplicity + j;
            }
        }
        for (i = 0; i < dd->sizeZ; i++) {
            dd->univ[i]->index = dd->invpermZ[i];
        }
    } else {
        permutation = ABC_ALLOC(int,dd->sizeZ);
        if (permutation == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        for (i = 0; i < dd->size; i++) {
            for (j = 0; j < multiplicity; j++) {
                permutation[i * multiplicity + j] =
                    dd->invperm[i] * multiplicity + j;
            }
        }
        for (i = dd->size * multiplicity; i < dd->sizeZ; i++) {
            permutation[i] = i;
        }
        res = Cudd_zddShuffleHeap(dd, permutation);
        ABC_FREE(permutation);
        if (res == 0) return(0);
    }
    /* Copy and expand the variable group tree if it exists. */
    if (dd->treeZ != NULL) {
        Cudd_FreeZddTree(dd);
    }
    if (dd->tree != NULL) {
        dd->treeZ = Mtr_CopyTree(dd->tree, multiplicity);
        if (dd->treeZ == NULL) return(0);
    } else if (multiplicity > 1) {
        dd->treeZ = Mtr_InitGroupTree(0, dd->sizeZ);
        if (dd->treeZ == NULL) return(0);
        dd->treeZ->index = dd->invpermZ[0];
    }
    /* Create groups for the ZDD variables derived from the same BDD variable.
    */
    if (multiplicity > 1) {
        char *vmask, *lmask;

        vmask = ABC_ALLOC(char, dd->size);
        if (vmask == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        lmask =  ABC_ALLOC(char, dd->size);
        if (lmask == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        for (i = 0; i < dd->size; i++) {
            vmask[i] = lmask[i] = 0;
        }
        res = addMultiplicityGroups(dd,dd->treeZ,multiplicity,vmask,lmask);
        ABC_FREE(vmask);
        ABC_FREE(lmask);
        if (res == 0) return(0);
    }
    return(1);

}